

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O2

int __thiscall
CAPSFile::AddGapRecord(CAPSFile *this,StreamRecording *record,int nb_byte_to_add,uchar byte)

{
  uchar *__src;
  uint uVar1;
  uchar *__dest;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = -8;
  uVar2 = 5;
  uVar3 = 1;
  for (uVar1 = nb_byte_to_add << 3; 0 < (int)uVar1; uVar1 = uVar1 >> 8) {
    iVar4 = iVar4 + 8;
    uVar2 = uVar2 + 1;
    uVar3 = (uint)(byte)((char)uVar3 + 0x20);
  }
  uVar1 = record->size;
  if (uVar1 - record->offset <= uVar2) {
    __src = record->buffer;
    __dest = (uchar *)operator_new__((ulong)(uVar1 * 2));
    record->buffer = __dest;
    memcpy(__dest,__src,(ulong)uVar1);
    record->size = uVar1 * 2;
    if (__src != (uchar *)0x0) {
      operator_delete__(__src);
    }
  }
  if (uVar2 != 5) {
    while( true ) {
      uVar2 = record->offset;
      record->offset = uVar2 + 1;
      record->buffer[uVar2] = (uchar)uVar3;
      if (iVar4 == -8) break;
      uVar3 = (nb_byte_to_add << 3) >> ((byte)iVar4 & 0x1f);
      iVar4 = iVar4 + -8;
    }
    uVar2 = record->offset;
    record->offset = uVar2 + 1;
    record->buffer[uVar2] = '\"';
    uVar2 = record->offset;
    record->offset = uVar2 + 1;
    record->buffer[uVar2] = '\b';
    uVar2 = record->offset;
    record->offset = uVar2 + 1;
    record->buffer[uVar2] = byte;
    uVar2 = record->offset;
    record->offset = uVar2 + 1;
    record->buffer[uVar2] = '\0';
  }
  return 0;
}

Assistant:

int CAPSFile::AddGapRecord(StreamRecording* record, int nb_byte_to_add, unsigned char byte)
{
   unsigned int size = 0;
   nb_byte_to_add *= 8;
   int tmp = nb_byte_to_add;
   while (tmp > 0)
   {
      tmp >>= 8;
      size++;
   }

   if (record->size - record->offset <= (size + 5))
   {
      unsigned char* tmp = record->buffer;

      record->buffer = new unsigned char[record->size * 2];
      memcpy(record->buffer, tmp, record->size);
      record->size = record->size * 2;
      delete[]tmp;
   }
   if (size > 0)
   {
      record->buffer[record->offset++] = (size << 5) | 0x01;
      for (unsigned int c = 0; c < size; c++)
      {
         record->buffer[record->offset++] = ((nb_byte_to_add >> (8 * (size - (c + 1)))) & 0xFF);
      }

      // Sample now
      record->buffer[record->offset++] = (1 << 5) | 0x02;
      record->buffer[record->offset++] = 8;
      record->buffer[record->offset++] = byte; // Sample
      record->buffer[record->offset++] = 0x00; // End of data
   }
   return 0;
}